

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O1

void __thiscall configFileReader::openFile(configFileReader *this)

{
  ifstream *this_00;
  
  if (this->isOpen == false) {
    this_00 = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(this_00);
    this->configFile = (ifstream *)this_00;
    std::ifstream::open((char *)this_00,(_Ios_Openmode)(this->fileName)._M_dataplus._M_p);
    this->isOpen = true;
  }
  return;
}

Assistant:

void configFileReader::openFile() {
    if (!isOpen) {
        configFile = new ifstream();
        configFile->open(fileName.c_str(), std::ifstream::in);
        isOpen = true;
    }
}